

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::SobolSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,SobolSampler *this,int n,Allocator alloc)

{
  undefined8 *puVar1;
  pointer pSVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int64_t iVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar8;
  uintptr_t iptr;
  ulong uVar9;
  allocator_type local_29;
  ulong uVar7;
  
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_29);
  if (n == 0) {
    uVar7 = 0;
  }
  else {
    iVar6 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,(long)n << 5,8)
    ;
    uVar7 = CONCAT44(extraout_var,iVar6);
  }
  if (0 < n) {
    pSVar2 = (__return_storage_ptr__->
             super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    uVar9 = uVar7;
    do {
      uVar3 = *(undefined8 *)&this->randomizeStrategy;
      uVar4 = *(undefined8 *)&(this->pixel).super_Tuple2<pbrt::Point2,_int>.y;
      iVar5 = this->sobolIndex;
      puVar1 = (undefined8 *)(uVar7 + lVar8 * 4);
      *puVar1 = *(undefined8 *)this;
      puVar1[1] = uVar3;
      puVar1[2] = uVar4;
      puVar1[3] = iVar5;
      *(ulong *)((long)&(pSVar2->
                        super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                        ).bits + lVar8) = uVar9 | 0x5000000000000;
      uVar9 = uVar9 + 0x20;
      lVar8 = lVar8 + 8;
    } while ((ulong)(uint)n << 3 != lVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> SobolSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    SobolSampler *samplerMem = (SobolSampler *)alloc.allocate_object<SobolSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}